

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O1

OPJ_BOOL opj_t2_decode_packets
                   (opj_tcd_t *tcd,opj_t2_t *p_t2,OPJ_UINT32 p_tile_no,opj_tcd_tile_t *p_tile,
                   OPJ_BYTE *p_src,OPJ_UINT32 *p_data_read,OPJ_UINT32 p_max_len,
                   opj_codestream_index_t *p_cstr_index,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  opj_tcp_t *poVar3;
  opj_tcd_precinct_t *poVar4;
  bool bVar5;
  OPJ_BOOL OVar6;
  OPJ_UINT32 OVar7;
  uint uVar8;
  void *__s;
  ulong uVar9;
  opj_tcd_layer_t *poVar10;
  opj_tcd_band_t *poVar11;
  opj_image_t *poVar12;
  opj_pi_iterator_t *poVar13;
  int iVar14;
  opj_tcd_cblk_enc_t *poVar15;
  uint uVar16;
  opj_tcd_resolution_t *poVar17;
  OPJ_UINT32 OVar18;
  int iVar19;
  OPJ_UINT32 OVar20;
  int *piVar21;
  OPJ_BYTE *pOVar22;
  opj_tcd_precinct_t **ppoVar23;
  OPJ_BYTE *pOVar24;
  OPJ_UINT32 OVar25;
  ulong uVar26;
  opj_event_mgr_t *p_manager_00;
  OPJ_UINT32 local_dc;
  opj_pi_iterator_t *local_d8;
  ulong local_d0;
  OPJ_UINT32 local_c4;
  opj_image_t *local_c0;
  OPJ_BOOL l_read_data;
  opj_tcd_tile_t *local_b0;
  ulong local_a8;
  void *local_a0;
  OPJ_BYTE *local_98;
  uint local_90;
  int local_8c;
  opj_pi_iterator_t *local_88;
  opj_tcp_t *local_80;
  uint local_74;
  int local_70;
  int local_6c;
  OPJ_BYTE *local_68;
  opj_tcd_resolution_t *local_60;
  opj_tcd_band_t *local_58;
  opj_t2_t *local_50;
  OPJ_UINT32 *local_48;
  OPJ_BYTE *local_40;
  opj_tcd_t *local_38;
  
  local_c0 = p_t2->image;
  poVar3 = p_t2->cp->tcps;
  OVar7 = poVar3[p_tile_no].numpocs;
  local_b0 = p_tile;
  local_50 = p_t2;
  local_48 = p_data_read;
  local_38 = tcd;
  local_d8 = opj_pi_create_decode(local_c0,p_t2->cp,p_tile_no);
  if (local_d8 == (opj_pi_iterator_t *)0x0) {
LAB_00136041:
    OVar6 = 0;
  }
  else {
    local_a8 = (ulong)p_max_len;
    local_80 = poVar3 + p_tile_no;
    local_c4 = OVar7 + 1;
    uVar8 = 0;
    local_98 = p_src;
    local_88 = local_d8;
    local_40 = p_src;
    do {
      poVar12 = local_c0;
      local_74 = uVar8;
      if (((local_d8->poc).prg == OPJ_PROG_UNKNOWN) ||
         (__s = opj_malloc((ulong)local_c0->numcomps << 2), __s == (void *)0x0)) {
        opj_pi_destroy(local_88,local_c4);
      }
      else {
        local_a0 = __s;
        memset(__s,1,(ulong)poVar12->numcomps << 2);
        do {
          poVar13 = local_d8;
          p_manager_00 = (opj_event_mgr_t *)0x13598b;
          OVar6 = opj_pi_next(local_d8);
          if (OVar6 == 0) {
            local_d8 = poVar13 + 1;
            opj_free(local_a0);
            bVar5 = true;
            goto LAB_00135ff3;
          }
          if (poVar13->layno < local_80->num_layers_to_decode) {
            uVar8 = poVar13->resno;
            if (local_b0->comps[poVar13->compno].minimum_num_resolutions <= uVar8)
            goto LAB_00135a5b;
            poVar17 = local_b0->comps[poVar13->compno].resolutions;
            if (poVar17[uVar8].numbands == 0) goto LAB_00135a5b;
            ppoVar23 = &poVar17[uVar8].bands[0].precincts;
            bVar5 = true;
            uVar26 = 0;
            do {
              poVar4 = *ppoVar23;
              uVar16 = local_d8->precno;
              p_manager_00 = (opj_event_mgr_t *)(ulong)(uint)poVar4[uVar16].y1;
              OVar6 = opj_tcd_is_subband_area_of_interest
                                (local_38,local_d8->compno,local_d8->resno,
                                 *(OPJ_UINT32 *)(ppoVar23 + -1),poVar4[uVar16].x0,poVar4[uVar16].y0,
                                 poVar4[uVar16].x1,poVar4[uVar16].y1);
              if (OVar6 != 0) {
                bVar5 = false;
                break;
              }
              uVar26 = uVar26 + 1;
              ppoVar23 = ppoVar23 + 6;
            } while (uVar26 < poVar17[uVar8].numbands);
            poVar13 = local_d8;
            if (bVar5) goto LAB_00135a5b;
            *(undefined4 *)((long)local_a0 + (ulong)local_d8->compno * 4) = 0;
            local_dc = 0;
            OVar6 = opj_t2_read_packet_header
                              (local_50,local_b0,local_80,local_d8,&l_read_data,local_98,&local_dc,
                               (OPJ_UINT32)local_a8,(opj_packet_info_t *)p_manager,p_manager_00);
            OVar7 = local_dc;
            bVar5 = true;
            poVar12 = local_c0;
            poVar13 = local_d8;
            if (OVar6 == 0) {
              local_d0 = 0;
            }
            else {
              local_d0 = (ulong)local_dc;
              if (l_read_data == 0) {
                bVar5 = false;
              }
              else {
                pOVar24 = local_98 + local_d0;
                local_dc = 0;
                poVar17 = local_b0->comps[local_d8->compno].resolutions;
                local_68 = pOVar24;
                if (poVar17[local_d8->resno].numbands != 0) {
                  poVar17 = poVar17 + local_d8->resno;
                  poVar11 = poVar17->bands;
                  pOVar22 = pOVar24 + ((int)local_a8 - OVar7);
                  uVar8 = 0;
                  local_60 = poVar17;
                  do {
                    if ((poVar11->x1 == poVar11->x0) || (poVar11->y1 == poVar11->y0)) {
                      uVar16 = 0;
                      poVar11 = poVar11 + 1;
                    }
                    else {
                      uVar16 = poVar13->precno;
                      poVar4 = poVar11->precincts;
                      local_70 = poVar4[uVar16].ch * poVar4[uVar16].cw;
                      local_90 = uVar8;
                      local_58 = poVar11;
                      if (local_70 != 0) {
                        poVar15 = poVar4[uVar16].cblks.enc;
                        iVar19 = 0;
                        do {
                          if (poVar15->numbps == 0) {
                            poVar15 = (opj_tcd_cblk_enc_t *)&poVar15[1].layers;
                            uVar16 = 7;
                          }
                          else {
                            OVar7 = poVar15->numlenbits;
                            piVar21 = (int *)poVar15->data;
                            if (OVar7 == 0) {
                              OVar7 = 1;
LAB_00135def:
                              poVar15->numlenbits = OVar7;
                            }
                            else {
                              piVar21 = piVar21 + (ulong)(OVar7 - 1) * 6;
                              if (piVar21[1] == piVar21[3]) {
                                piVar21 = piVar21 + 6;
                                OVar7 = OVar7 + 1;
                                goto LAB_00135def;
                              }
                            }
                            iVar14 = 0;
                            local_8c = iVar19;
                            do {
                              if ((CARRY8((ulong)(uint)piVar21[5],(ulong)pOVar24)) ||
                                 (pOVar22 < pOVar24 + (uint)piVar21[5])) {
                                piVar21[5] = (int)pOVar22 - (int)pOVar24;
                                iVar14 = 1;
                              }
                              if (poVar15->numpassesinlayers == poVar15->totalpasses) {
                                uVar8 = poVar15->totalpasses * 2 + 1;
                                local_6c = iVar14;
                                poVar10 = (opj_tcd_layer_t *)
                                          opj_realloc(poVar15->layers,(ulong)uVar8 << 4);
                                if (poVar10 == (opj_tcd_layer_t *)0x0) {
                                  opj_event_msg(p_manager,1,
                                                "cannot allocate opj_tcd_seg_data_chunk_t* array");
                                  uVar16 = 1;
                                  poVar12 = local_c0;
                                  poVar13 = local_d8;
                                  iVar19 = local_8c;
                                  goto LAB_00135eef;
                                }
                                poVar15->layers = poVar10;
                                poVar15->totalpasses = uVar8;
                                iVar14 = local_6c;
                              }
                              poVar10 = poVar15->layers;
                              uVar8 = poVar15->numpassesinlayers;
                              *(OPJ_BYTE **)(&poVar10->numpasses + (ulong)uVar8 * 4) = pOVar24;
                              uVar16 = piVar21[5];
                              *(uint *)(&poVar10->disto + (ulong)uVar8 * 2) = uVar16;
                              poVar15->numpassesinlayers = uVar8 + 1;
                              *piVar21 = *piVar21 + uVar16;
                              OVar7 = piVar21[4];
                              iVar19 = piVar21[1];
                              piVar21[1] = iVar19 + OVar7;
                              OVar1 = poVar15->numbps;
                              OVar18 = OVar1 - OVar7;
                              poVar15->numbps = OVar18;
                              piVar21[2] = iVar19 + OVar7;
                              if (OVar18 != 0) {
                                piVar21 = piVar21 + 6;
                                poVar15->numlenbits = poVar15->numlenbits + 1;
                              }
                              pOVar24 = pOVar24 + uVar16;
                            } while ((OVar1 != OVar7) && (iVar14 == 0));
                            poVar15->data_size = poVar15->numlenbits;
                            poVar15 = (opj_tcd_cblk_enc_t *)&poVar15[1].layers;
                            uVar16 = 0;
                            poVar12 = local_c0;
                            poVar13 = local_d8;
                            iVar19 = local_8c;
                          }
LAB_00135eef:
                          if ((uVar16 != 7) &&
                             (poVar11 = local_58, poVar17 = local_60, uVar8 = local_90, uVar16 != 0)
                             ) goto LAB_00135f31;
                          iVar19 = iVar19 + 1;
                        } while (iVar19 != local_70);
                      }
                      uVar16 = 0;
                      poVar11 = local_58 + 1;
                      poVar17 = local_60;
                      uVar8 = local_90;
                    }
LAB_00135f31:
                    if ((uVar16 & 3) != 0) {
                      local_d0 = 0;
                      bVar5 = true;
                      goto LAB_00135f78;
                    }
                    uVar8 = uVar8 + 1;
                  } while (uVar8 < poVar17->numbands);
                }
                local_dc = (int)pOVar24 - (int)local_68;
                local_d0 = (ulong)((int)local_d0 + local_dc);
                bVar5 = false;
              }
            }
LAB_00135f78:
            if (bVar5) goto LAB_00135f7d;
            uVar8 = poVar12->comps[poVar13->compno].resno_decoded;
            if (uVar8 < local_d8->resno) {
              uVar8 = local_d8->resno;
            }
            poVar12->comps[poVar13->compno].resno_decoded = uVar8;
            uVar26 = local_d0;
LAB_00135c1d:
            uVar9 = (ulong)local_d8->compno;
            if (*(int *)((long)local_a0 + uVar9 * 4) != 0) {
              if (local_c0->comps[uVar9].resno_decoded == 0) {
                local_c0->comps[uVar9].resno_decoded =
                     local_b0->comps[uVar9].minimum_num_resolutions - 1;
              }
            }
            local_98 = local_98 + uVar26;
            local_a8 = (ulong)(uint)((int)local_a8 - (int)uVar26);
            bVar5 = true;
          }
          else {
LAB_00135a5b:
            local_dc = 0;
            OVar6 = opj_t2_read_packet_header
                              (local_50,local_b0,local_80,poVar13,&l_read_data,local_98,&local_dc,
                               (OPJ_UINT32)local_a8,(opj_packet_info_t *)p_manager,p_manager_00);
            OVar7 = local_dc;
            if (OVar6 == 0) {
              uVar26 = 0;
            }
            else {
              uVar9 = (ulong)local_dc;
              uVar26 = uVar9;
              if (l_read_data != 0) {
                poVar17 = local_b0->comps[local_d8->compno].resolutions;
                local_dc = 0;
                OVar1 = poVar17[local_d8->resno].numbands;
                if (OVar1 != 0) {
                  uVar16 = (int)local_a8 - OVar7;
                  poVar11 = poVar17[local_d8->resno].bands;
                  uVar8 = local_d8->precno;
                  local_dc = 0;
                  OVar18 = 0;
                  do {
                    if ((poVar11->x1 != poVar11->x0) && (poVar11->y1 != poVar11->y0)) {
                      poVar4 = poVar11->precincts;
                      iVar19 = poVar4[uVar8].ch * poVar4[uVar8].cw;
                      if (iVar19 != 0) {
                        poVar15 = poVar4[uVar8].cblks.enc;
                        iVar14 = 0;
                        do {
                          if (poVar15->numbps != 0) {
                            OVar25 = poVar15->numlenbits;
                            pOVar24 = poVar15->data;
                            if (OVar25 == 0) {
                              OVar25 = 1;
LAB_00135b8e:
                              poVar15->numlenbits = OVar25;
                            }
                            else {
                              pOVar24 = pOVar24 + (ulong)(OVar25 - 1) * 0x18;
                              if (*(int *)(pOVar24 + 4) == *(int *)(pOVar24 + 0xc)) {
                                pOVar24 = pOVar24 + 0x18;
                                OVar25 = OVar25 + 1;
                                goto LAB_00135b8e;
                              }
                            }
                            bVar5 = false;
                            OVar25 = poVar15->numbps;
                            do {
                              if ((CARRY4(*(uint *)(pOVar24 + 0x14),local_dc)) ||
                                 (uVar16 < *(uint *)(pOVar24 + 0x14) + local_dc)) {
                                *(uint *)(pOVar24 + 0x14) = uVar16 - local_dc;
                                bVar5 = true;
                              }
                              local_dc = local_dc + *(int *)(pOVar24 + 0x14);
                              OVar2 = *(OPJ_UINT32 *)(pOVar24 + 0x10);
                              *(OPJ_UINT32 *)(pOVar24 + 4) = *(int *)(pOVar24 + 4) + OVar2;
                              OVar20 = OVar25 - OVar2;
                              if (OVar20 != 0) {
                                pOVar24 = pOVar24 + 0x18;
                                poVar15->numlenbits = poVar15->numlenbits + 1;
                              }
                            } while ((OVar25 != OVar2) && (OVar25 = OVar20, !bVar5));
                            poVar15->numbps = OVar20;
                          }
                          poVar15 = (opj_tcd_cblk_enc_t *)&poVar15[1].layers;
                          iVar14 = iVar14 + 1;
                        } while (iVar14 != iVar19);
                      }
                    }
                    poVar11 = poVar11 + 1;
                    OVar18 = OVar18 + 1;
                  } while (OVar18 != OVar1);
                }
                uVar26 = (ulong)(OVar7 + local_dc);
                local_d0 = uVar9;
              }
            }
            if (OVar6 != 0) goto LAB_00135c1d;
LAB_00135f7d:
            opj_pi_destroy(local_88,local_c4);
            opj_free(local_a0);
            bVar5 = false;
          }
        } while (bVar5);
      }
      bVar5 = false;
LAB_00135ff3:
      pOVar24 = local_40;
      if (!bVar5) goto LAB_00136041;
      uVar8 = local_74 + 1;
    } while (uVar8 <= local_80->numpocs);
    opj_pi_destroy(local_88,local_c4);
    *local_48 = (int)local_98 - (int)pOVar24;
    OVar6 = 1;
  }
  return OVar6;
}

Assistant:

OPJ_BOOL opj_t2_decode_packets(opj_tcd_t* tcd,
                               opj_t2_t *p_t2,
                               OPJ_UINT32 p_tile_no,
                               opj_tcd_tile_t *p_tile,
                               OPJ_BYTE *p_src,
                               OPJ_UINT32 * p_data_read,
                               OPJ_UINT32 p_max_len,
                               opj_codestream_index_t *p_cstr_index,
                               opj_event_mgr_t *p_manager)
{
    OPJ_BYTE *l_current_data = p_src;
    opj_pi_iterator_t *l_pi = 00;
    OPJ_UINT32 pino;
    opj_image_t *l_image = p_t2->image;
    opj_cp_t *l_cp = p_t2->cp;
    opj_tcp_t *l_tcp = &(p_t2->cp->tcps[p_tile_no]);
    OPJ_UINT32 l_nb_bytes_read;
    OPJ_UINT32 l_nb_pocs = l_tcp->numpocs + 1;
    opj_pi_iterator_t *l_current_pi = 00;
#ifdef TODO_MSD
    OPJ_UINT32 curtp = 0;
    OPJ_UINT32 tp_start_packno;
#endif
    opj_packet_info_t *l_pack_info = 00;
    opj_image_comp_t* l_img_comp = 00;

    OPJ_ARG_NOT_USED(p_cstr_index);

#ifdef TODO_MSD
    if (p_cstr_index) {
        l_pack_info = p_cstr_index->tile_index[p_tile_no].packet;
    }
#endif

    /* create a packet iterator */
    l_pi = opj_pi_create_decode(l_image, l_cp, p_tile_no);
    if (!l_pi) {
        return OPJ_FALSE;
    }


    l_current_pi = l_pi;

    for (pino = 0; pino <= l_tcp->numpocs; ++pino) {

        /* if the resolution needed is too low, one dim of the tilec could be equal to zero
         * and no packets are used to decode this resolution and
         * l_current_pi->resno is always >= p_tile->comps[l_current_pi->compno].minimum_num_resolutions
         * and no l_img_comp->resno_decoded are computed
         */
        OPJ_BOOL* first_pass_failed = NULL;

        if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
            /* TODO ADE : add an error */
            opj_pi_destroy(l_pi, l_nb_pocs);
            return OPJ_FALSE;
        }

        first_pass_failed = (OPJ_BOOL*)opj_malloc(l_image->numcomps * sizeof(OPJ_BOOL));
        if (!first_pass_failed) {
            opj_pi_destroy(l_pi, l_nb_pocs);
            return OPJ_FALSE;
        }
        memset(first_pass_failed, OPJ_TRUE, l_image->numcomps * sizeof(OPJ_BOOL));

        while (opj_pi_next(l_current_pi)) {
            OPJ_BOOL skip_packet = OPJ_FALSE;
            JAS_FPRINTF(stderr,
                        "packet offset=00000166 prg=%d cmptno=%02d rlvlno=%02d prcno=%03d lyrno=%02d\n\n",
                        l_current_pi->poc.prg1, l_current_pi->compno, l_current_pi->resno,
                        l_current_pi->precno, l_current_pi->layno);

            /* If the packet layer is greater or equal than the maximum */
            /* number of layers, skip the packet */
            if (l_current_pi->layno >= l_tcp->num_layers_to_decode) {
                skip_packet = OPJ_TRUE;
            }
            /* If the packet resolution number is greater than the minimum */
            /* number of resolution allowed, skip the packet */
            else if (l_current_pi->resno >=
                     p_tile->comps[l_current_pi->compno].minimum_num_resolutions) {
                skip_packet = OPJ_TRUE;
            } else {
                /* If no precincts of any band intersects the area of interest, */
                /* skip the packet */
                OPJ_UINT32 bandno;
                opj_tcd_tilecomp_t *tilec = &p_tile->comps[l_current_pi->compno];
                opj_tcd_resolution_t *res = &tilec->resolutions[l_current_pi->resno];

                skip_packet = OPJ_TRUE;
                for (bandno = 0; bandno < res->numbands; ++bandno) {
                    opj_tcd_band_t* band = &res->bands[bandno];
                    opj_tcd_precinct_t* prec = &band->precincts[l_current_pi->precno];

                    if (opj_tcd_is_subband_area_of_interest(tcd,
                                                            l_current_pi->compno,
                                                            l_current_pi->resno,
                                                            band->bandno,
                                                            (OPJ_UINT32)prec->x0,
                                                            (OPJ_UINT32)prec->y0,
                                                            (OPJ_UINT32)prec->x1,
                                                            (OPJ_UINT32)prec->y1)) {
                        skip_packet = OPJ_FALSE;
                        break;
                    }
                }
                /*
                                printf("packet cmptno=%02d rlvlno=%02d prcno=%03d lyrno=%02d -> %s\n",
                                    l_current_pi->compno, l_current_pi->resno,
                                    l_current_pi->precno, l_current_pi->layno, skip_packet ? "skipped" : "kept");
                */
            }

            if (!skip_packet) {
                l_nb_bytes_read = 0;

                first_pass_failed[l_current_pi->compno] = OPJ_FALSE;

                if (! opj_t2_decode_packet(p_t2, p_tile, l_tcp, l_current_pi, l_current_data,
                                           &l_nb_bytes_read, p_max_len, l_pack_info, p_manager)) {
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    opj_free(first_pass_failed);
                    return OPJ_FALSE;
                }

                l_img_comp = &(l_image->comps[l_current_pi->compno]);
                l_img_comp->resno_decoded = opj_uint_max(l_current_pi->resno,
                                            l_img_comp->resno_decoded);
            } else {
                l_nb_bytes_read = 0;
                if (! opj_t2_skip_packet(p_t2, p_tile, l_tcp, l_current_pi, l_current_data,
                                         &l_nb_bytes_read, p_max_len, l_pack_info, p_manager)) {
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    opj_free(first_pass_failed);
                    return OPJ_FALSE;
                }
            }

            if (first_pass_failed[l_current_pi->compno]) {
                l_img_comp = &(l_image->comps[l_current_pi->compno]);
                if (l_img_comp->resno_decoded == 0) {
                    l_img_comp->resno_decoded =
                        p_tile->comps[l_current_pi->compno].minimum_num_resolutions - 1;
                }
            }

            l_current_data += l_nb_bytes_read;
            p_max_len -= l_nb_bytes_read;

            /* INDEX >> */
#ifdef TODO_MSD
            if (p_cstr_info) {
                opj_tile_info_v2_t *info_TL = &p_cstr_info->tile[p_tile_no];
                opj_packet_info_t *info_PK = &info_TL->packet[p_cstr_info->packno];
                tp_start_packno = 0;
                if (!p_cstr_info->packno) {
                    info_PK->start_pos = info_TL->end_header + 1;
                } else if (info_TL->packet[p_cstr_info->packno - 1].end_pos >=
                           (OPJ_INT32)
                           p_cstr_info->tile[p_tile_no].tp[curtp].tp_end_pos) { /* New tile part */
                    info_TL->tp[curtp].tp_numpacks = p_cstr_info->packno -
                                                     tp_start_packno; /* Number of packets in previous tile-part */
                    tp_start_packno = p_cstr_info->packno;
                    curtp++;
                    info_PK->start_pos = p_cstr_info->tile[p_tile_no].tp[curtp].tp_end_header + 1;
                } else {
                    info_PK->start_pos = (l_cp->m_specific_param.m_enc.m_tp_on &&
                                          info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[p_cstr_info->packno -
                                                                      1].end_pos + 1;
                }
                info_PK->end_pos = info_PK->start_pos + l_nb_bytes_read - 1;
                info_PK->end_ph_pos += info_PK->start_pos -
                                       1;  /* End of packet header which now only represents the distance */
                ++p_cstr_info->packno;
            }
#endif
            /* << INDEX */
        }
        ++l_current_pi;

        opj_free(first_pass_failed);
    }
    /* INDEX >> */
#ifdef TODO_MSD
    if
    (p_cstr_info) {
        p_cstr_info->tile[p_tile_no].tp[curtp].tp_numpacks = p_cstr_info->packno -
                tp_start_packno; /* Number of packets in last tile-part */
    }
#endif
    /* << INDEX */

    /* don't forget to release pi */
    opj_pi_destroy(l_pi, l_nb_pocs);
    *p_data_read = (OPJ_UINT32)(l_current_data - p_src);
    return OPJ_TRUE;
}